

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void init_ref_frame_bufs(AV1_COMP *cpi)

{
  RefCntBuffer *pRVar1;
  int i;
  AV1_COMMON *cm;
  AV1_COMP *cpi_local;
  
  if ((cpi->common).cur_frame != (RefCntBuffer *)0x0) {
    pRVar1 = (cpi->common).cur_frame;
    pRVar1->ref_count = pRVar1->ref_count + -1;
    (cpi->common).cur_frame = (RefCntBuffer *)0x0;
  }
  for (i = 0; i < 8; i = i + 1) {
    if ((cpi->common).ref_frame_map[i] != (RefCntBuffer *)0x0) {
      pRVar1 = (cpi->common).ref_frame_map[i];
      pRVar1->ref_count = pRVar1->ref_count + -1;
      (cpi->common).ref_frame_map[i] = (RefCntBuffer *)0x0;
    }
  }
  return;
}

Assistant:

static void init_ref_frame_bufs(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  int i;
  if (cm->cur_frame) {
    cm->cur_frame->ref_count--;
    cm->cur_frame = NULL;
  }
  for (i = 0; i < REF_FRAMES; ++i) {
    if (cm->ref_frame_map[i]) {
      cm->ref_frame_map[i]->ref_count--;
      cm->ref_frame_map[i] = NULL;
    }
  }
#ifndef NDEBUG
  BufferPool *const pool = cm->buffer_pool;
  for (i = 0; i < pool->num_frame_bufs; ++i) {
    assert(pool->frame_bufs[i].ref_count == 0);
  }
#endif
}